

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

string * ot::commissioner::StripComments(string *__return_storage_ptr__,string *aStr)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  bool bVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    bVar3 = false;
    bVar7 = false;
    while( true ) {
      while( true ) {
        pcVar2 = (aStr->_M_dataplus)._M_p;
        while( true ) {
          uVar6 = uVar4;
          if (aStr->_M_string_length <= uVar6) {
            return __return_storage_ptr__;
          }
          uVar4 = uVar6 + 1;
          cVar5 = '\0';
          if (uVar4 < aStr->_M_string_length) {
            cVar5 = pcVar2[uVar4];
          }
          cVar1 = pcVar2[uVar6];
          if (!bVar3) break;
          bVar3 = cVar5 != '/' || cVar1 != '*';
          if (cVar5 == '/' && cVar1 == '*') {
            uVar4 = uVar6 + 2;
          }
        }
        if (bVar7) break;
        if ((cVar1 == '/') && (cVar5 == '*')) {
          uVar4 = uVar6 + 2;
          bVar3 = true;
          bVar7 = false;
        }
        else if ((cVar1 == '/') && (cVar5 == '/')) {
          uVar4 = uVar6 + 2;
          bVar7 = true;
          bVar3 = false;
        }
        else {
          bVar3 = false;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar7 = false;
        }
      }
      if ((cVar1 == '\r') && (cVar5 == '\n')) break;
      bVar7 = cVar1 != '\n';
      bVar3 = false;
    }
    uVar4 = uVar6 + 2;
  } while( true );
}

Assistant:

static std::string StripComments(const std::string &aStr)
{
    std::string ret;
    bool        inInlineComment = false;
    bool        inBlockComment  = false;

    for (size_t i = 0; i < aStr.size();)
    {
        int c     = aStr[i];
        int nextc = i + 1 < aStr.size() ? aStr[i + 1] : '\0';

        if (inBlockComment)
        {
            if (c == '*' && nextc == '/')
            {
                inBlockComment = false;
                i += 2;
            }
            else
            {
                ++i;
            }
        }
        else if (inInlineComment)
        {
            if (c == '\r' && nextc == '\n')
            {
                inInlineComment = false;
                i += 2;
            }
            else if (c == '\n')
            {
                inInlineComment = false;
                ++i;
            }
            else
            {
                ++i;
            }
        }
        else
        {
            if (c == '/' && nextc == '*')
            {
                inBlockComment = true;
                i += 2;
            }
            else if (c == '/' && nextc == '/')
            {
                inInlineComment = true;
                i += 2;
            }
            else
            {
                ret.push_back(c);
                ++i;
            }
        }
    }

    return ret;
}